

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkatom.c
# Opt level: O3

LispPTR compare_chars(char *char1,char *char2,DLword length)

{
  undefined6 in_register_00000012;
  long lVar1;
  
  if ((int)CONCAT62(in_register_00000012,length) != 0) {
    lVar1 = 0;
    do {
      if (*(char *)((ulong)(char1 + lVar1) ^ 3) != char2[lVar1]) {
        return 0;
      }
      lVar1 = lVar1 + 1;
    } while ((uint)length != (uint)lVar1);
  }
  return 1;
}

Assistant:

LispPTR compare_chars(const char *char1, const char *char2, DLword length) {
#ifndef BYTESWAP
  if (memcmp(char1, char2, length) == 0)
#else
  if (bytecmp(char1, char2, length))
#endif /* BYTESWAP */

  {
    return (T);
  } else {
    return (NIL);
  }

}